

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderError1InputBlocks::getVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError1InputBlocks *this,
          uint n_program_object)

{
  allocator<char> local_1d;
  uint local_1c;
  TessellationShaderError1InputBlocks *pTStack_18;
  uint n_program_object_local;
  TessellationShaderError1InputBlocks *this_local;
  
  local_1c = n_program_object;
  pTStack_18 = this;
  this_local = (TessellationShaderError1InputBlocks *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${SHADER_IO_BLOCKS_REQUIRE}\n\nout IN_TC\n{\n    vec4 test_block_field;\n} test_block;\n\nvoid main()\n{\n    test_block.test_block_field = vec4(1.0, 2.0, 3.0, gl_VertexID);\n}\n"
             ,&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError1InputBlocks::getVertexShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "${SHADER_IO_BLOCKS_REQUIRE}\n"
		   "\n"
		   "out IN_TC\n"
		   "{\n"
		   "    vec4 test_block_field;\n"
		   "} test_block;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    test_block.test_block_field = vec4(1.0, 2.0, 3.0, gl_VertexID);\n"
		   "}\n";
}